

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::full_time(sequence *__return_storage_ptr__,spec *s)

{
  either local_50;
  sequence local_30;
  
  local_time(&local_30,s);
  time_offset(&local_50,s);
  sequence::sequence<toml::detail::sequence,toml::detail::either>
            (__return_storage_ptr__,&local_30,&local_50);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence full_time(const spec& s)
{
    return sequence(local_time(s), time_offset(s));
}